

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chull.cpp
# Opt level: O2

void masc::polygon::hull2d
               (ply_vertex *s,ply_vertex *e,
               list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull
               )

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _List_node_base *p_Var4;
  _List_node_base local_28;
  
  local_28._M_prev = (_List_node_base *)s;
  iVar2 = (*e->_vptr_ply_vertex[3])(e);
  std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::
  push_back(hull,(value_type *)&local_28._M_prev);
  iVar3 = (**(_func_int **)((long)(local_28._M_prev)->_M_next + 0x18))();
  local_28._M_next = (_List_node_base *)CONCAT44(extraout_var_00,iVar3);
  std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::
  push_back(hull,(value_type *)&local_28);
  std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::
  push_front(hull,(value_type *)
                  ((hull->
                   super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                   )._M_impl._M_node.super__List_node_base._M_prev + 1));
  p_Var4 = (hull->
           super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
           )._M_impl._M_node.super__List_node_base._M_prev + 1;
  while( true ) {
    local_28._M_next = (_List_node_base *)(*(code *)p_Var4->_M_next->_M_next[1]._M_prev)();
    if ((ply_vertex *)local_28._M_next == (ply_vertex *)CONCAT44(extraout_var,iVar2)) break;
    bVar1 = inHull((ply_vertex *)local_28._M_next,hull);
    p_Var4 = &local_28;
    if (!bVar1) {
      updateHullTop((ply_vertex *)local_28._M_next,hull);
      updateHullBot((ply_vertex *)local_28._M_next,hull);
      std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
      ::push_back(hull,(value_type *)&local_28);
      std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
      ::push_front(hull,(value_type *)&local_28);
      p_Var4 = &local_28;
    }
  }
  std::__cxx11::list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::
  pop_back(hull);
  return;
}

Assistant:

void hull2d(ply_vertex * s, ply_vertex * e, list<ply_vertex*>& hull )
{
    //avoid letting s and e in the bridge
    //if( s->getBridge()!=NULL ) s=s->getBridge()->v2;
    //if( e->getBridge()!=NULL ) e=e->getBridge()->v1;
    ply_vertex * ne=next(e);

    //init the hull
    hull.push_back(s);
    hull.push_back(next(s));
    hull.push_front(hull.back());

    //incrementally create the hull
    ply_vertex * ptr=next(hull.back());
    while(ptr!=ne){

        //check if the ptr is contained in the hull
        if( !inHull(ptr,hull) ){
            updateHullTop(ptr,hull);
            updateHullBot(ptr,hull);
            hull.push_back(ptr);
            hull.push_front(ptr);
        }

        ptr=next(ptr);

    }//end while(ptr!=ne);
    
    hull.pop_back();
}